

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitonicsort.hpp
# Opt level: O1

void mxx::impl::
     bitonic_merge<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
               (undefined8 begin,undefined8 end,long param_3,int param_4,int param_5,
               undefined4 param_6)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  int rank;
  uint local_34;
  
  if (*(int *)(param_3 + 0x14) < param_4 || param_5 <= *(int *)(param_3 + 0x14)) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&local_34);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",(ulong)local_34,
           "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/bitonicsort.hpp"
           ,0x60,"bitonic_merge","pbeg <= comm.rank() && comm.rank() < pend");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  if (param_5 - param_4 < 2) {
    return;
  }
  dVar5 = log((double)(param_5 - param_4));
  dVar5 = ceil(dVar5 / 0.6931471805599453);
  dVar5 = exp2(dVar5);
  iVar2 = (int)dVar5 / 2;
  iVar3 = iVar2 + param_4;
  iVar1 = *(int *)(param_3 + 0x14);
  if (iVar1 < iVar3) {
    iVar4 = iVar3;
    if (iVar2 + iVar1 < param_5) {
      bitonic_split<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
                (begin,end,param_3,iVar2 + iVar1,param_6);
      goto LAB_0013bcd7;
    }
    if (iVar1 < iVar3) goto LAB_0013bcd7;
  }
  bitonic_split<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
            (begin,end,param_3,iVar1 - iVar2,param_6);
  iVar4 = param_5;
  param_4 = iVar3;
LAB_0013bcd7:
  bitonic_merge<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
            (begin,end,param_3,param_4,iVar4,param_6);
  return;
}

Assistant:

void bitonic_merge(_Iterator begin, _Iterator end, _Compare comp, const mxx::comm& comm, int pbeg, int pend, int dir) {
    MXX_ASSERT(pbeg <= comm.rank() && comm.rank() < pend);

    // get size and terminate at recursive base-case
    int size = pend - pbeg;
    if (size <= 1)
        return;

    // get next greater power of 2
    int p2 = pow(2, ceil(log(size)/log(2)));
    // merge with splits as is done in the power of 2 case
    int pmid = pbeg + p2/2;

    if (comm.rank() < pmid && comm.rank() + p2/2 < pend) {
        // this processor has a partner in the second half
        int partner_rank = comm.rank() + p2/2;
        bitonic_split(begin, end, comp, comm, partner_rank, dir);
        bitonic_merge(begin, end, comp, comm, pbeg, pmid, dir);
    } else if (comm.rank() < pmid) {
        // this process doesn't have a partner but has to recursively
        // participate in the next merge
        bitonic_merge(begin, end, comp, comm, pbeg, pmid, dir);
    } else { // if (comm.rank() >= pmid)
        int partner_rank = comm.rank() - p2/2;
        bitonic_split(begin, end, comp, comm, partner_rank, dir);
        bitonic_merge(begin, end, comp, comm, pmid, pend, dir);
    }
}